

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedBase85TTF
          (ImFontAtlas *this,char *compressed_ttf_data_base85,float size_pixels,
          ImFontConfig *font_cfg,ImWchar *glyph_ranges)

{
  int iVar1;
  size_t sVar2;
  uchar *dst;
  ImFont *ptr;
  char *in_RSI;
  ImFont *font;
  void *compressed_ttf;
  int compressed_ttf_size;
  ImWchar *in_stack_00000050;
  ImFontConfig *in_stack_00000058;
  float in_stack_00000060;
  int in_stack_00000064;
  void *in_stack_00000068;
  ImFontAtlas *in_stack_00000070;
  size_t in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  
  sVar2 = strlen(in_RSI);
  iVar1 = ((int)sVar2 + 4) / 5 << 2;
  dst = (uchar *)ImGui::MemAlloc(in_stack_ffffffffffffffc0);
  Decode85((uchar *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),dst);
  ptr = AddFontFromMemoryCompressedTTF
                  (in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060,
                   in_stack_00000058,in_stack_00000050);
  ImGui::MemFree(ptr);
  return ptr;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedBase85TTF(const char* compressed_ttf_data_base85, float size_pixels, const ImFontConfig* font_cfg, const ImWchar* glyph_ranges)
{
    int compressed_ttf_size = (((int)strlen(compressed_ttf_data_base85) + 4) / 5) * 4;
    void* compressed_ttf = ImGui::MemAlloc((size_t)compressed_ttf_size);
    Decode85((const unsigned char*)compressed_ttf_data_base85, (unsigned char*)compressed_ttf);
    ImFont* font = AddFontFromMemoryCompressedTTF(compressed_ttf, compressed_ttf_size, size_pixels, font_cfg, glyph_ranges);
    ImGui::MemFree(compressed_ttf);
    return font;
}